

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  KeyInfo *pKVar2;
  bool bVar3;
  u8 uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ulong in_R11;
  uint uVar17;
  Mem *pMem2;
  u32 szHdr1;
  Mem mem1;
  uint local_c4;
  Mem *local_c0;
  byte *local_b8;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  UnpackedRecord *local_98;
  uint local_8c;
  u8 *local_88;
  double local_80;
  long local_78;
  long local_70;
  MemValue local_68;
  byte *local_60;
  uint local_58;
  undefined2 local_54;
  u8 local_52;
  sqlite3 *local_50;
  
  pMem2 = pPKey2->aMem;
  local_b8 = (byte *)pKey1;
  local_ac = nKey1;
  if (bSkip == 0) {
    local_a8 = (uint)*pKey1;
    uVar13 = 1;
    if ((char)*pKey1 < '\0') {
      bVar5 = sqlite3GetVarint32((uchar *)pKey1,&local_a8);
      uVar13 = (ulong)bVar5;
    }
    uVar17 = 0;
    uVar14 = local_a8;
  }
  else {
    local_68.nZero = (int)*(byte *)((long)pKey1 + 1);
    uVar13 = 2;
    if ((char)*(byte *)((long)pKey1 + 1) < '\0') {
      uVar4 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&local_68.nZero);
      uVar13 = (ulong)(byte)(uVar4 + 1);
    }
    local_a8 = (uint)*local_b8;
    if ((ulong)(uint)local_68.nZero < 0x80) {
      uVar14 = (uint)""[(uint)local_68.nZero];
    }
    else {
      uVar14 = local_68.nZero - 0xcU >> 1;
    }
    pMem2 = pMem2 + 1;
    uVar17 = 1;
    uVar14 = uVar14 + local_a8;
  }
  uVar15 = (ulong)uVar14;
  if (local_ac < uVar14) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x151e1,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    iVar16 = 0;
    pPKey2->errCode = '\v';
  }
  else {
    local_88 = &pPKey2->errCode;
    uVar14 = 0;
    local_8c = local_a8;
    pbVar12 = local_b8;
    local_98 = pPKey2;
    do {
      uVar8 = pMem2->flags;
      if ((uVar8 & 0x24) == 0) {
        if ((uVar8 & 8) != 0) {
          local_c4 = (uint)pbVar12[uVar13];
          if (local_c4 < 10) {
            uVar9 = (uint)pbVar12[uVar13];
            if (uVar9 == 0) {
              uVar14 = 0xffffffff;
            }
            else {
              local_c0 = (Mem *)CONCAT44(local_c0._4_4_,(int)in_R11);
              local_a4 = (uint)uVar13;
              local_a0 = uVar15;
              sqlite3VdbeSerialGet(pbVar12 + (uVar15 & 0xffffffff),uVar9,(Mem *)&local_68);
              dVar1 = (pMem2->u).r;
              uVar15 = local_a0;
              if (uVar9 == 7) {
                in_R11 = (ulong)local_c0 & 0xffffffff;
                pbVar12 = local_b8;
                if (dVar1 <= (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) {
                  uVar13 = (ulong)local_a4;
                  if (dVar1 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) goto LAB_001625ed;
                }
                else {
                  uVar13 = (ulong)local_a4;
                  uVar14 = 0xffffffff;
                }
              }
              else {
                local_78 = CONCAT44(local_68.i._4_4_,local_68.nZero);
                uVar14 = (uint)(dVar1 < (double)local_78);
                if ((double)local_78 < dVar1) {
                  uVar14 = 0xffffffff;
                }
                uVar13 = (ulong)local_a4;
                local_80 = dVar1;
LAB_001623ba:
                in_R11 = (ulong)local_c0 & 0xffffffff;
                pbVar12 = local_b8;
              }
            }
          }
          else {
            uVar14 = (uint)(local_c4 != 10) * 2 - 1;
          }
          goto LAB_0016249b;
        }
        if ((uVar8 & 2) != 0) {
          local_c4 = (uint)pbVar12[uVar13];
          if ((char)pbVar12[uVar13] < '\0') {
            in_R11 = in_R11 & 0xffffffff;
            local_c0 = pMem2;
            sqlite3GetVarint32(pbVar12 + uVar13,&local_c4);
            pbVar12 = local_b8;
            pMem2 = local_c0;
          }
          if (0xb < local_c4) {
            if ((local_c4 & 1) == 0) {
LAB_001625ed:
              uVar14 = 1;
              goto LAB_0016249b;
            }
            local_58 = local_c4 - 0xc >> 1;
            if ((local_58 + (int)uVar15 <= local_ac) &&
               (pKVar2 = pPKey2->pKeyInfo, (int)uVar17 < (int)(uint)pKVar2->nAllField)) {
              local_c0 = (Mem *)CONCAT44(local_c0._4_4_,(int)in_R11);
              if (pKVar2->aColl[(int)uVar17] == (CollSeq *)0x0) {
                uVar9 = pMem2->n;
                uVar14 = local_58 - uVar9;
                if ((int)local_58 < (int)uVar9) {
                  uVar9 = local_58;
                }
                uVar9 = memcmp(pbVar12 + (uVar15 & 0xffffffff),pMem2->z,(long)(int)uVar9);
                if (uVar9 != 0) {
                  uVar14 = uVar9;
                }
              }
              else {
                local_52 = pKVar2->enc;
                local_50 = pKVar2->db;
                local_54 = 2;
                local_60 = pbVar12 + (uVar15 & 0xffffffff);
                uVar14 = vdbeCompareMemString
                                   ((Mem *)&local_68,pMem2,pKVar2->aColl[(int)uVar17],local_88);
              }
              goto LAB_001623ba;
            }
            local_c0 = pMem2;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1522e,
                        "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
            in_R11 = 0;
            pPKey2->errCode = '\v';
            iVar6 = 1;
            pbVar12 = local_b8;
            pMem2 = local_c0;
            goto LAB_00162654;
          }
          goto LAB_00162495;
        }
        bVar5 = pbVar12[uVar13];
        local_c4 = (uint)bVar5;
        if ((uVar8 & 0x10) == 0) {
          uVar14 = (uint)(bVar5 != 10 && bVar5 != 0);
          goto LAB_0016249b;
        }
        if ((char)bVar5 < '\0') {
          in_R11 = in_R11 & 0xffffffff;
          local_c0 = pMem2;
          sqlite3GetVarint32(pbVar12 + uVar13,&local_c4);
          pbVar12 = local_b8;
          pMem2 = local_c0;
        }
        if ((local_c4 & 1) != 0 || local_c4 < 0xc) goto LAB_00162495;
        local_c0 = (Mem *)CONCAT44(local_c0._4_4_,uVar17);
        uVar9 = local_c4 - 0xc >> 1;
        uVar10 = uVar9 + (int)uVar15;
        if (local_ac < uVar10) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1524c,
                      "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
          in_R11 = 0;
          local_98->errCode = '\v';
LAB_0016263b:
          pbVar12 = local_b8;
          uVar17 = (uint)local_c0;
        }
        else {
          if ((pMem2->flags & 0x400) == 0) {
            uVar14 = pMem2->n;
            uVar17 = uVar14;
            if ((int)uVar9 < (int)uVar14) {
              uVar17 = uVar9;
            }
            in_R11 = in_R11 & 0xffffffff;
            uVar17 = memcmp(pbVar12 + (uVar15 & 0xffffffff),pMem2->z,(long)(int)uVar17);
            uVar14 = uVar9 - uVar14;
            if (uVar17 != 0) {
              uVar14 = uVar17;
            }
            goto LAB_0016263b;
          }
          if (local_c4 - 0xc != 0) {
            uVar11 = 0;
            do {
              if (pbVar12[uVar11 + (uVar15 & 0xffffffff)] != 0) {
                uVar14 = 1;
                goto LAB_00162640;
              }
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          uVar14 = uVar9 - (pMem2->u).nZero;
        }
LAB_00162640:
        iVar6 = 1;
        pPKey2 = local_98;
        if (uVar10 <= local_ac) goto LAB_0016249b;
        goto LAB_00162654;
      }
      bVar5 = pbVar12[uVar13];
      local_c4 = (uint)bVar5;
      if (9 < local_c4) {
        uVar14 = (uint)(local_c4 != 10) * 2 - 1;
        goto LAB_0016249b;
      }
      uVar9 = (uint)bVar5;
      if (uVar9 == 0) goto LAB_00162495;
      uVar11 = uVar15 & 0xffffffff;
      if (uVar9 == 7) {
        sqlite3VdbeSerialGet(pbVar12 + uVar11,7,(Mem *)&local_68);
        in_R11 = in_R11 & 0xffffffff;
        local_70 = (pMem2->u).i;
        pbVar12 = local_b8;
        uVar14 = -(uint)((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < (double)local_70);
        if ((double)local_70 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) {
          uVar14 = 1;
        }
        goto LAB_0016249b;
      }
      switch(bVar5) {
      case 1:
        uVar11 = (ulong)(char)pbVar12[uVar11];
        goto LAB_0016248c;
      case 2:
        uVar7 = (long)(char)pbVar12[uVar11] << 8;
        uVar11 = (ulong)pbVar12[uVar11 + 1];
        break;
      case 3:
        uVar7 = (ulong)pbVar12[uVar11 + 1] << 8 | (long)(char)pbVar12[uVar11] << 0x10;
        uVar11 = (ulong)pbVar12[uVar11 + 2];
        break;
      case 4:
        uVar7 = (ulong)pbVar12[uVar11 + 2] << 8 |
                (long)(int)((uint)pbVar12[uVar11] << 0x18) | (ulong)pbVar12[uVar11 + 1] << 0x10;
        uVar11 = (ulong)pbVar12[uVar11 + 3];
        break;
      case 5:
        uVar9 = *(uint *)(pbVar12 + uVar11 + 2);
        uVar7 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                       uVar9 << 0x18);
        uVar11 = (ulong)(uint)(int)CONCAT11(pbVar12[uVar11],pbVar12[uVar11 + 1]) << 0x20;
        break;
      case 6:
        uVar11 = *(ulong *)(pbVar12 + uVar11);
        uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                 (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                 (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                 (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
        goto LAB_0016248c;
      default:
        uVar11 = (ulong)(uVar9 - 8);
        goto LAB_0016248c;
      }
      uVar11 = uVar11 | uVar7;
LAB_0016248c:
      if ((long)uVar11 < (pMem2->u).i) {
LAB_00162495:
        uVar14 = 0xffffffff;
      }
      else if ((pMem2->u).i < (long)uVar11) {
        uVar14 = 1;
      }
LAB_0016249b:
      if (uVar14 == 0) {
        uVar17 = uVar17 + 1;
        uVar14 = 0;
        iVar6 = 3;
        if (uVar17 != pPKey2->nField) {
          uVar11 = (ulong)local_c4;
          if (uVar11 < 0x80) {
            uVar9 = (uint)""[uVar11];
          }
          else {
            uVar9 = local_c4 - 0xc >> 1;
          }
          pMem2 = pMem2 + 1;
          uVar9 = (int)uVar15 + uVar9;
          uVar15 = (ulong)uVar9;
          if (uVar9 <= local_ac) {
            iVar6 = 1;
            if (0x7f < local_c4) {
              do {
                iVar6 = iVar6 + 1;
                bVar3 = 0x3fff < uVar11;
                uVar11 = uVar11 >> 7;
              } while (bVar3);
            }
            uVar9 = (int)uVar13 + iVar6;
            uVar13 = (ulong)uVar9;
            iVar6 = 0;
            if (uVar9 < local_8c) {
              uVar14 = 0;
            }
            else {
              uVar14 = 0;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x15278,
                          "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
              uVar13 = (ulong)uVar9;
              local_98->errCode = '\v';
              iVar6 = 1;
              in_R11 = 0;
              pPKey2 = local_98;
              pbVar12 = local_b8;
            }
          }
        }
      }
      else {
        bVar5 = pPKey2->pKeyInfo->aSortFlags[(int)uVar17];
        iVar6 = 1;
        if (bVar5 != 0) {
          if ((bVar5 & 2) != 0) {
            uVar8 = 1;
            if (local_c4 != 0) {
              uVar8 = pMem2->flags & 1;
            }
            if ((bVar5 & 1) == uVar8) goto LAB_001624db;
          }
          uVar14 = -uVar14;
        }
LAB_001624db:
        in_R11 = (ulong)uVar14;
      }
LAB_00162654:
      iVar16 = (int)in_R11;
    } while (iVar6 == 0);
    if (iVar6 == 3) {
      pPKey2->eqSeen = '\x01';
      iVar16 = (int)pPKey2->default_rc;
    }
  }
  return iVar16;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1 = aKey1[1];
    if( s1<0x80 ){
      idx1 = 2;
    }else{
      idx1 = 1 + sqlite3GetVarint32(&aKey1[1], &s1);
    }
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    if( (szHdr1 = aKey1[0])<0x80 ){
      idx1 = 1;
    }else{
      idx1 = sqlite3GetVarint32(aKey1, &szHdr1);
    }
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortFlags!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  while( 1 /*exit-by-break*/ ){
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n;
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0 && serial_type!=10);
    }

    if( rc!=0 ){
      int sortFlags = pPKey2->pKeyInfo->aSortFlags[i];
      if( sortFlags ){
        if( (sortFlags & KEYINFO_ORDER_BIGNULL)==0
         || ((sortFlags & KEYINFO_ORDER_DESC)
           !=(serial_type==0 || (pRhs->flags&MEM_Null)))
        ){
          rc = -rc;
        }
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    if( d1>(unsigned)nKey1 ) break;
    idx1 += sqlite3VarintLen(serial_type);
    if( idx1>=(unsigned)szHdr1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;  /* Corrupt index */
    }
  }

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc)
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}